

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeFenceCreate
          (ze_command_queue_handle_t hCommandQueue,ze_fence_desc_t *desc,ze_fence_handle_t *phFence)

{
  object_t<_ze_fence_handle_t_*> *poVar1;
  bad_alloc *anon_var_0;
  ze_pfnFenceCreate_t pfnCreate;
  dditable_t *dditable;
  ze_fence_handle_t *pp_Stack_28;
  ze_result_t result;
  ze_fence_handle_t *phFence_local;
  ze_fence_desc_t *desc_local;
  ze_command_queue_handle_t hCommandQueue_local;
  
  dditable._4_4_ = 0;
  pfnCreate = *(ze_pfnFenceCreate_t *)(hCommandQueue + 8);
  if (*(code **)(pfnCreate + 0x430) == (code *)0x0) {
    hCommandQueue_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    desc_local = *(ze_fence_desc_t **)hCommandQueue;
    pp_Stack_28 = phFence;
    phFence_local = (ze_fence_handle_t *)desc;
    dditable._4_4_ = (**(code **)(pfnCreate + 0x430))(desc_local,desc,phFence);
    hCommandQueue_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_ze_fence_handle_t*>,_ze_fence_handle_t*>::
               getInstance<_ze_fence_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_fence_handle_t*>,_ze_fence_handle_t*> *)
                          (context + 0x3c0),pp_Stack_28,(dditable_t **)&pfnCreate);
      *pp_Stack_28 = (ze_fence_handle_t)poVar1;
      hCommandQueue_local._4_4_ = dditable._4_4_;
    }
  }
  return hCommandQueue_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFenceCreate(
        ze_command_queue_handle_t hCommandQueue,        ///< [in] handle of command queue
        const ze_fence_desc_t* desc,                    ///< [in] pointer to fence descriptor
        ze_fence_handle_t* phFence                      ///< [out] pointer to handle of fence object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_queue_object_t*>( hCommandQueue )->dditable;
        auto pfnCreate = dditable->ze.Fence.pfnCreate;
        if( nullptr == pfnCreate )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandQueue = reinterpret_cast<ze_command_queue_object_t*>( hCommandQueue )->handle;

        // forward to device-driver
        result = pfnCreate( hCommandQueue, desc, phFence );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phFence = reinterpret_cast<ze_fence_handle_t>(
                context->ze_fence_factory.getInstance( *phFence, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }